

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O2

void pltcalc::doit(bool skipHeader,bool ordOutput,FILE **fout,
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *parquetFileNames)

{
  size_t sVar1;
  int iVar2;
  undefined7 in_register_00000031;
  FILE *pFVar3;
  code *OutputData;
  code *OutputData_00;
  vector<period_occ_granular,_std::allocator<period_occ_granular>_> vp_granular;
  int summarycalcstream_type;
  
  loadoccurrence();
  if (((int)CONCAT71(in_register_00000031,ordOutput) != 0) ||
     ((parquetFileNames->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    getperiodweights();
  }
  summarycalcstream_type = 0;
  fread(&summarycalcstream_type,4,1,_stdin);
  iVar2 = summarycalcstream_type;
  if ((~summarycalcstream_type & 0x3000000U) != 0) {
    std::operator<<((ostream *)&std::cerr,"Not a summarycalc stream type\n");
    iVar2 = -1;
LAB_00102ad3:
    exit(iVar2);
  }
  fread(&samplesize_,4,1,_stdin);
  if (fout[2] != (FILE *)0x0) {
    getintervals();
  }
  sVar1 = (parquetFileNames->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 == 0 && !ordOutput) {
    OutputData = (_func_void_outrec_granular_ptr_int_FILE_ptr *)0x0;
    OutputData_00 = (_func_void_outrec_granular_ptr_int_FILE_ptr *)0x0;
  }
  else {
    OutputData = outputrows_ord<pltcalc::outrec_granular_const&>;
    if (granular_date_ == 0) {
      OutputData = (_func_void_outrec_granular_ptr_int_FILE_ptr *)0x0;
    }
    OutputData_00 = outputrows_ord<pltcalc::outrec_const&>;
    if (granular_date_ != 0) {
      OutputData_00 = (_func_void_outrec_granular_ptr_int_FILE_ptr *)0x0;
    }
    if (ordOutput) {
      if (!skipHeader) {
        if ((FILE *)*fout != (FILE *)0x0) {
          fwrite("Period,PeriodWeight,EventId,Year,Month,Day,Hour,Minute,SummaryId,SampleType,ChanceOfLoss,MeanLoss,SDLoss,MaxLoss,FootprintExposure,MeanImpactedExposure,MaxImpactedExposure\n"
                 ,0xac,1,(FILE *)*fout);
        }
        if ((FILE *)fout[1] != (FILE *)0x0) {
          fwrite("Period,PeriodWeight,EventId,Year,Month,Day,Hour,Minute,SummaryId,SampleId,Loss,ImpactedExposure\n"
                 ,0x60,1,(FILE *)fout[1]);
        }
        if ((FILE *)fout[2] != (FILE *)0x0) {
          fwrite("Period,PeriodWeight,EventId,Year,Month,Day,Hour,Minute,SummaryId,Quantile,Loss\n",
                 0x4f,1,(FILE *)fout[2]);
        }
      }
      pFVar3 = *fout;
      goto LAB_00102a16;
    }
    if (sVar1 != 0) {
      pFVar3 = (FILE *)0x0;
      goto LAB_00102a16;
    }
  }
  if (date_algorithm_ == 0) {
    if (!skipHeader) {
      puts("type,summary_id,period_no,event_id,mean,standard_deviation,exposure_value,occ_date_id");
    }
    if (granular_date_ != 0) {
      fwrite("FATAL: Unknown date algorithm\n",0x1e,1,_stderr);
      iVar2 = 1;
      goto LAB_00102ad3;
    }
    OutputData_00 = outputrows<pltcalc::outrec_const&>;
    pFVar3 = _stdout;
  }
  else {
    if (!skipHeader) {
      puts(
          "type,summary_id,period_no,event_id,mean,standard_deviation,exposure_value,occ_year,occ_month,occ_day"
          );
    }
    pFVar3 = _stdout;
    if (granular_date_ == 0) {
      OutputData_00 = outputrows_da<pltcalc::outrec_const&>;
    }
    else {
      OutputData = outputrows_da<pltcalc::outrec_granular_const&>;
    }
  }
LAB_00102a16:
  if (firstOutput == '\x01') {
    vp_granular.super__Vector_base<period_occ_granular,_std::allocator<period_occ_granular>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x3e8;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&vp_granular);
    firstOutput = '\0';
  }
  if ((iVar2 & 0xffffffU) == 1) {
    if (granular_date_ == 0) {
      vp_granular.super__Vector_base<period_occ_granular,_std::allocator<period_occ_granular>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vp_granular.super__Vector_base<period_occ_granular,_std::allocator<period_occ_granular>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vp_granular.super__Vector_base<period_occ_granular,_std::allocator<period_occ_granular>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      read_input<pltcalc::outrec,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,std::vector<period_occ,std::allocator<period_occ>>>
                (OutputData_00,pFVar3,fout,
                 (map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
                  *)m_occ_legacy,(vector<period_occ,_std::allocator<period_occ>_> *)&vp_granular);
      std::_Vector_base<period_occ,_std::allocator<period_occ>_>::~_Vector_base
                ((_Vector_base<period_occ,_std::allocator<period_occ>_> *)&vp_granular);
    }
    else {
      vp_granular.super__Vector_base<period_occ_granular,_std::allocator<period_occ_granular>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vp_granular.super__Vector_base<period_occ_granular,_std::allocator<period_occ_granular>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vp_granular.super__Vector_base<period_occ_granular,_std::allocator<period_occ_granular>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      read_input<pltcalc::outrec_granular,std::map<int,std::vector<period_occ_granular,std::allocator<period_occ_granular>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ_granular,std::allocator<period_occ_granular>>>>>,std::vector<period_occ_granular,std::allocator<period_occ_granular>>>
                (OutputData,pFVar3,fout,
                 (map<int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>_>_>
                  *)m_occ_granular,&vp_granular);
      std::_Vector_base<period_occ_granular,_std::allocator<period_occ_granular>_>::~_Vector_base
                (&vp_granular.
                  super__Vector_base<period_occ_granular,_std::allocator<period_occ_granular>_>);
    }
  }
  return;
}

Assistant:

void doit(bool skipHeader, bool ordOutput, FILE **fout,
		  std::map<int, std::string> &parquetFileNames)
	{
		loadoccurrence();
		if (ordOutput || parquetFileNames.size() != 0) getperiodweights();
		int summarycalcstream_type = 0;
		fread(&summarycalcstream_type, sizeof(summarycalcstream_type),
		      1, stdin);
		int stream_type = summarycalcstream_type & summarycalc_id;

		if (stream_type != summarycalc_id) {
			std::cerr << "Not a summarycalc stream type\n";
			exit(-1);
		}
		stream_type = streamno_mask & summarycalcstream_type;
		fread(&samplesize_, sizeof(samplesize_), 1, stdin);
#ifdef HAVE_PARQUET
		if (fout[QPLT] != nullptr || parquetFileNames.find(OasisParquet::QPLT) != parquetFileNames.end())
#else
		if (fout[QPLT] != nullptr)
#endif
		{
			getintervals();
		}

		void (*OutputDataGranular)(const outrec_granular&, const int,
					   FILE*) = nullptr;
		void (*OutputDataLegacy)(const outrec&, const int,
					 FILE*) = nullptr;
		FILE * outFile = nullptr;
		if (ordOutput || parquetFileNames.size() != 0) {
			if (granular_date_) {
				OutputDataGranular = outputrows_ord<const outrec_granular&>;
			} else {
				OutputDataLegacy = outputrows_ord<const outrec&>;
			}
		}

		if (ordOutput) {
			if (skipHeader == false) {
				if (fout[MPLT] != nullptr) {
					fprintf(fout[MPLT],
						"Period,PeriodWeight,EventId,"
						"Year,Month,Day,Hour,Minute,"
						"SummaryId,SampleType,"
						"ChanceOfLoss,MeanLoss,SDLoss,"
						"MaxLoss,FootprintExposure,"
						"MeanImpactedExposure,"
						"MaxImpactedExposure\n");
				}
				if (fout[SPLT] != nullptr) {
					fprintf(fout[SPLT],
						"Period,PeriodWeight,EventId,"
						"Year,Month,Day,Hour,Minute,"
						"SummaryId,SampleId,Loss,"
						"ImpactedExposure\n");
				}
				if (fout[QPLT] != nullptr) {
					fprintf(fout[QPLT],
						"Period,PeriodWeight,EventId,"
						"Year,Month,Day,Hour,Minute,"
						"SummaryId,Quantile,Loss\n");
				}
			}
			outFile = fout[MPLT];
		} else if (parquetFileNames.size() == 0) {
			if (date_algorithm_) {
				if (skipHeader == false) {
					printf("type,summary_id,period_no,event_id,mean,standard_deviation,exposure_value,occ_year,occ_month,occ_day\n");
				}
				if (granular_date_) {
					OutputDataGranular = outputrows_da<const outrec_granular&>;
				} else {
					OutputDataLegacy = outputrows_da<const outrec&>;
				}
			} else {
				if (skipHeader == false) {
					printf("type,summary_id,period_no,event_id,mean,standard_deviation,exposure_value,occ_date_id\n");
				}
				if (granular_date_) {   // Should not get here
					fprintf(stderr, "FATAL: Unknown date algorithm\n");
					exit(EXIT_FAILURE);
				} else {
					OutputDataLegacy = outputrows<const outrec&>;
				}
			}
			outFile = stdout;
		}

#ifdef HAVE_PARQUET
		for (auto iter = parquetFileNames.begin();
		  iter != parquetFileNames.end(); ++iter) {
			os_[iter->first] = OasisParquet::GetParquetStreamWriter(iter->first, iter->second);
		}
#endif

		if (firstOutput == true) {
			std::this_thread::sleep_for(std::chrono::milliseconds(PIPE_DELAY)); // used to stop possible race condition with kat
			firstOutput = false;
		}
		if (stream_type == 1) {
			if (granular_date_) {
				std::vector<period_occ_granular> vp_granular;
				read_input(OutputDataGranular, outFile, fout,
					   m_occ_granular, vp_granular);
			} else {

				std::vector<period_occ> vp_legacy;
				read_input(OutputDataLegacy, outFile, fout,
					   m_occ_legacy, vp_legacy);
			}
		}
	}

}